

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

CURLcode base64_encode(char *table64,char *inputbuff,size_t insize,char **outptr,size_t *outlen)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *padstr;
  uchar *in;
  char *base64data;
  char *output;
  size_t *outlen_local;
  char **outptr_local;
  size_t insize_local;
  char *inputbuff_local;
  char *table64_local;
  
  pcVar2 = table64 + 0x40;
  *outptr = (char *)0x0;
  *outlen = 0;
  outptr_local = (char **)insize;
  if (insize == 0) {
    outptr_local = (char **)strlen(inputbuff);
  }
  pcVar3 = (char *)malloc((((long)outptr_local + 2U) / 3) * 4 + 1);
  padstr = inputbuff;
  base64data = pcVar3;
  if (pcVar3 == (char *)0x0) {
    table64_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    for (; (char **)0x2 < outptr_local; outptr_local = (char **)((long)outptr_local + -3)) {
      *base64data = table64[(int)(uint)(byte)*padstr >> 2];
      base64data[1] = table64[(int)(((byte)*padstr & 3) << 4 | (int)(uint)(byte)padstr[1] >> 4)];
      base64data[2] =
           table64[(int)(((byte)padstr[1] & 0xf) << 2 | (int)((byte)padstr[2] & 0xc0) >> 6)];
      base64data[3] = table64[(int)((byte)padstr[2] & 0x3f)];
      padstr = padstr + 3;
      base64data = base64data + 4;
    }
    pcVar1 = base64data;
    if (outptr_local != (char **)0x0) {
      *base64data = table64[(int)(uint)(byte)*padstr >> 2];
      if (outptr_local == (char **)0x1) {
        base64data[1] = table64[(int)(((byte)*padstr & 3) << 4)];
        pcVar1 = base64data + 2;
        if (*pcVar2 != '\0') {
          base64data[2] = *pcVar2;
          base64data[3] = *pcVar2;
          pcVar1 = base64data + 4;
        }
      }
      else {
        base64data[1] =
             table64[(int)(((byte)*padstr & 3) << 4 | (int)((byte)padstr[1] & 0xf0) >> 4)];
        base64data[2] = table64[(int)(((byte)padstr[1] & 0xf) << 2)];
        pcVar1 = base64data + 3;
        if (*pcVar2 != '\0') {
          base64data[3] = *pcVar2;
          pcVar1 = base64data + 4;
        }
      }
    }
    base64data = pcVar1;
    *base64data = '\0';
    *outptr = pcVar3;
    *outlen = (long)base64data - (long)pcVar3;
    table64_local._4_4_ = CURLE_OK;
  }
  return table64_local._4_4_;
}

Assistant:

static CURLcode base64_encode(const char *table64,
                              const char *inputbuff, size_t insize,
                              char **outptr, size_t *outlen)
{
  char *output;
  char *base64data;
  const unsigned char *in = (const unsigned char *)inputbuff;
  const char *padstr = &table64[64];    /* Point to padding string. */

  *outptr = NULL;
  *outlen = 0;

  if(!insize)
    insize = strlen(inputbuff);

#if SIZEOF_SIZE_T == 4
  if(insize > UINT_MAX/4)
    return CURLE_OUT_OF_MEMORY;
#endif

  base64data = output = malloc((insize + 2) / 3 * 4 + 1);
  if(!output)
    return CURLE_OUT_OF_MEMORY;

  while(insize >= 3) {
    *output++ = table64[ in[0] >> 2 ];
    *output++ = table64[ ((in[0] & 0x03) << 4) | (in[1] >> 4) ];
    *output++ = table64[ ((in[1] & 0x0F) << 2) | ((in[2] & 0xC0) >> 6) ];
    *output++ = table64[ in[2] & 0x3F ];
    insize -= 3;
    in += 3;
  }
  if(insize) {
    /* this is only one or two bytes now */
    *output++ = table64[ in[0] >> 2 ];
    if(insize == 1) {
      *output++ = table64[ ((in[0] & 0x03) << 4) ];
      if(*padstr) {
        *output++ = *padstr;
        *output++ = *padstr;
      }
    }
    else {
      /* insize == 2 */
      *output++ = table64[ ((in[0] & 0x03) << 4) | ((in[1] & 0xF0) >> 4) ];
      *output++ = table64[ ((in[1] & 0x0F) << 2) ];
      if(*padstr)
        *output++ = *padstr;
    }
  }

  /* Zero terminate */
  *output = '\0';

  /* Return the pointer to the new data (allocated memory) */
  *outptr = base64data;

  /* Return the length of the new data */
  *outlen = (size_t)(output - base64data);

  return CURLE_OK;
}